

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

QByteArray * __thiscall
EnumDef::qualifiedType(QByteArray *__return_storage_ptr__,EnumDef *this,ClassDef *cdef)

{
  Data *pDVar1;
  ClassDef *pCVar2;
  bool bVar3;
  long lVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QStringBuilder<QStringBuilder<const_QByteArray_&,_const_char_(&)[3]>,_const_QByteArray_&> local_40
  ;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = operator==(&this->name,(QByteArray *)cdef);
  pCVar2 = cdef;
  if (bVar3) {
    QVar5.m_data = (cdef->super_BaseDef).qualified.d.ptr;
    QVar5.m_size = (cdef->super_BaseDef).qualified.d.size;
    QVar6.m_data = "::";
    QVar6.m_size = 2;
    lVar4 = QtPrivate::findByteArray(QVar5,0,QVar6);
    if (lVar4 == -1) {
      pDVar1 = (this->name).d.d;
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = (this->name).d.ptr;
      (__return_storage_ptr__->d).size = (this->name).d.size;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0012226c;
    }
    pCVar2 = (ClassDef *)&(cdef->super_BaseDef).qualified;
  }
  local_40.a.a = (QByteArray *)pCVar2;
  local_40.a.b = (char (*) [3])0x13e817;
  local_40.b = &this->name;
  QStringBuilder<QStringBuilder<const_QByteArray_&,_const_char_(&)[3]>,_const_QByteArray_&>::
  convertTo<QByteArray>(__return_storage_ptr__,&local_40);
LAB_0012226c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray EnumDef::qualifiedType(const ClassDef *cdef) const
{
    if (name == cdef->classname) {
        // The name of the enclosing namespace is the same as the enum class name
        if (cdef->qualified.contains("::")) {
            // QTBUG-112996, fully qualify by using cdef->qualified to disambiguate enum
            // class name and enclosing namespace, e.g.:
            // namespace A { namespace B { Q_NAMESPACE; enum class B { }; Q_ENUM_NS(B) } }
            return cdef->qualified % "::" % name;
        } else {
            // Just "B"; otherwise the compiler complains about the type "B::B" inside
            // "B::staticMetaObject" in the generated code; e.g.:
            // namespace B { Q_NAMESPACE; enum class B { }; Q_ENUM_NS(B) }
            return name;
        }
    }
    return cdef->classname % "::" % name;
}